

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opts.h
# Opt level: O2

void __thiscall MDDOpts::parse_arg(MDDOpts *this,string *arg)

{
  bool bVar1;
  
  bVar1 = std::operator==(arg,"explain_minimal");
  if (bVar1) {
    this->expl_alg = E_MINIMAL;
  }
  else {
    bVar1 = std::operator==(arg,"explain_greedy");
    if (bVar1) {
      this->expl_alg = E_GREEDY;
    }
    else {
      bVar1 = std::operator==(arg,"discard_explanations");
      if (bVar1) {
        this->expl_strat = E_TEMP;
      }
      else {
        bVar1 = std::operator==(arg,"store_explanations");
        if (bVar1) {
          this->expl_strat = E_KEEP;
        }
      }
    }
  }
  return;
}

Assistant:

void parse_arg(const std::string& arg) {
		if (arg == "explain_minimal") {
			expl_alg = E_MINIMAL;
		} else if (arg == "explain_greedy") {
			expl_alg = E_GREEDY;
		} else if (arg == "discard_explanations") {
			expl_strat = E_TEMP;
		} else if (arg == "store_explanations") {
			expl_strat = E_KEEP;
		}
	}